

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void * xmlGzfileOpen_real(char *filename)

{
  int iVar1;
  int duped_fd;
  gzFile fd;
  char *path;
  char *filename_local;
  
  iVar1 = strcmp(filename,"-");
  if (iVar1 == 0) {
    iVar1 = fileno(_stdin);
    iVar1 = dup(iVar1);
    filename_local = (char *)gzdopen(iVar1,"rb");
    if ((filename_local == (char *)0x0) && (-1 < iVar1)) {
      close(iVar1);
    }
  }
  else {
    iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file://localhost/",0x11);
    if (iVar1 == 0) {
      fd = (gzFile)(filename + 0x10);
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file:///",8);
      fd = (gzFile)filename;
      if (iVar1 == 0) {
        fd = (gzFile)(filename + 7);
      }
    }
    if (fd == (gzFile)0x0) {
      filename_local = (char *)0x0;
    }
    else {
      iVar1 = xmlCheckFilename((char *)fd);
      if (iVar1 == 0) {
        filename_local = (char *)0x0;
      }
      else {
        filename_local = (char *)gzopen64(fd,"rb");
      }
    }
  }
  return filename_local;
}

Assistant:

static void *
xmlGzfileOpen_real (const char *filename) {
    const char *path = NULL;
    gzFile fd;

    if (!strcmp(filename, "-")) {
        int duped_fd = dup(fileno(stdin));
        fd = gzdopen(duped_fd, "rb");
        if (fd == Z_NULL && duped_fd >= 0) {
            close(duped_fd);  /* gzdOpen() does not close on failure */
        }

	return((void *) fd);
    }

    if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file://localhost/", 17))
#if defined (_WIN32)
	path = &filename[17];
#else
	path = &filename[16];
#endif
    else if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file:///", 8)) {
#if defined (_WIN32)
	path = &filename[8];
#else
	path = &filename[7];
#endif
    } else
	path = filename;

    if (path == NULL)
	return(NULL);
    if (!xmlCheckFilename(path))
        return(NULL);

#if defined(_WIN32)
    fd = xmlWrapGzOpenUtf8(path, "rb");
#else
    fd = gzopen(path, "rb");
#endif
    return((void *) fd);
}